

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileNumLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  SyToken *pVal;
  ulong in_RAX;
  jx9_value *pjVar1;
  sxi64 iVal;
  sxu32 iP2;
  sxu32 nIdx;
  sxu32 nIdx_1;
  
  pVal = pGen->pIn;
  _nIdx = in_RAX & 0xffffffff00000000;
  if ((pVal->nType & 1) == 0) {
    pjVar1 = jx9VmReserveConstObj(pGen->pVm,&nIdx);
    if (pjVar1 == (jx9_value *)0x0) {
LAB_00127206:
      GenStateOutOfMem(pGen);
      return -10;
    }
    jx9MemObjInitFromString(pGen->pVm,pjVar1,&pVal->sData);
    jx9MemObjToReal(pjVar1);
    iP2 = nIdx;
  }
  else {
    iVal = jx9TokenValueToInt64(&pVal->sData);
    _nIdx = _nIdx & 0xffffffff;
    pjVar1 = jx9VmReserveConstObj(pGen->pVm,&nIdx_1);
    if (pjVar1 == (jx9_value *)0x0) goto LAB_00127206;
    iP2 = nIdx_1;
    _nIdx = CONCAT44(nIdx_1,nIdx_1);
    jx9MemObjInitFromInt(pGen->pVm,pjVar1,iVal);
  }
  jx9VmEmitInstr(pGen->pVm,4,0,iP2,(void *)0x0,(sxu32 *)0x0);
  return 0;
}

Assistant:

static sxi32 jx9CompileNumLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	SyToken *pToken = pGen->pIn; /* Raw token */
	sxu32 nIdx = 0;
	if( pToken->nType & JX9_TK_INTEGER ){
		jx9_value *pObj;
		sxi64 iValue;
		iValue = jx9TokenValueToInt64(&pToken->sData);
		pObj = GenStateInstallNumLiteral(&(*pGen), &nIdx);
		if( pObj == 0 ){
			SXUNUSED(iCompileFlag); /* cc warning */
			return SXERR_ABORT;
		}
		jx9MemObjInitFromInt(pGen->pVm, pObj, iValue);
	}else{
		/* Real number */
		jx9_value *pObj;
		/* Reserve a new constant */
		pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
		if( pObj == 0 ){
			return GenStateOutOfMem(pGen);
		}
		jx9MemObjInitFromString(pGen->pVm, pObj, &pToken->sData);
		jx9MemObjToReal(pObj);
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}